

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O2

bool sptk::ComputeFirstOrderRegressionCoefficients
               (int n,vector<double,_std::allocator<double>_> *coefficients)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  
  if (coefficients != (vector<double,_std::allocator<double>_> *)0x0 && 0 < n) {
    uVar1 = n * 2 + 1;
    if ((long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (ulong)uVar1) {
      std::vector<double,_std::allocator<double>_>::resize(coefficients,(ulong)uVar1);
    }
    for (lVar2 = 0; iVar3 = (int)lVar2 - n, iVar3 <= n; lVar2 = lVar2 + 1) {
      (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar2] =
           (double)iVar3 * (1.0 / (double)(((n + 1) * n * uVar1) / 3));
    }
  }
  return coefficients != (vector<double,_std::allocator<double>_> *)0x0 && 0 < n;
}

Assistant:

bool ComputeFirstOrderRegressionCoefficients(
    int n, std::vector<double>* coefficients) {
  if (n <= 0 || NULL == coefficients) {
    return false;
  }

  const int a0(2 * n + 1);
  if (coefficients->size() != static_cast<std::size_t>(a0)) {
    coefficients->resize(a0);
  }
  const int a1(a0 * n * (n + 1) / 3);
  const double norm(1.0 / a1);
  for (int j(-n), i(0); j <= n; ++j, ++i) {
    (*coefficients)[i] = j * norm;
  }
  return true;
}